

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_package_fake.hxx
# Opt level: O0

int wait_for_sm_exec(vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *pkgs,size_t timeout_sec)

{
  bool bVar1;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *in_stack_00000018;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *in_stack_00000020;
  GcFunc gc_pkgs;
  lock_guard<std::mutex> l;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  lock_guard<std::mutex> *in_stack_ffffffffffffff80;
  EventAwaiter *this;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  function<void_()> *in_stack_ffffffffffffff90;
  int local_4;
  
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff80,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::operator=(in_stack_00000020,in_stack_00000018)
  ;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11436f);
  this = (EventAwaiter *)&stack0xffffffffffffff90;
  std::function<void()>::
  function<wait_for_sm_exec(std::vector<RaftPkg*,std::allocator<RaftPkg*>>const&,unsigned_long)::__0,void>
            (in_stack_ffffffffffffff90,
             (anon_class_1_0_00000001 *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  TestSuite::GcFunc::GcFunc
            ((GcFunc *)this,
             (function<void_()> *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  std::function<void_()>::~function((function<void_()> *)0x11439e);
  nuraft::EventAwaiter::reset((EventAwaiter *)0x1143aa);
  std::atomic<bool>::operator=((atomic<bool> *)this,(bool)in_stack_ffffffffffffff7f);
  bVar1 = check_pkgs();
  if (bVar1) {
    local_4 = 0;
  }
  else {
    nuraft::EventAwaiter::wait_ms(this,CONCAT17(bVar1,in_stack_ffffffffffffff78));
    bVar1 = std::atomic::operator_cast_to_bool
                      ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                      );
    if (bVar1) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  TestSuite::GcFunc::~GcFunc((GcFunc *)this);
  return local_4;
}

Assistant:

static int ATTR_UNUSED wait_for_sm_exec(const std::vector<RaftPkg*>& pkgs,
                                        size_t timeout_sec)
{
    {
        std::lock_guard<std::mutex> l(pkgs_to_watch_lock);
        pkgs_to_watch = pkgs;
    }
    TestSuite::GcFunc gc_pkgs([&]() {
        // Auto clear.
        std::lock_guard<std::mutex> l(pkgs_to_watch_lock);
        pkgs_to_watch.clear();
    });

    ea_wait_for_commit.reset();
    commit_done = false;
    if (check_pkgs()) {
        // Already executed even before sleeping.
        return 0;
    }
    ea_wait_for_commit.wait_ms(timeout_sec * 1000);

    if (commit_done) {
        return 0;
    }
    return -1;
}